

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

bool __thiscall
vera::Scene::addBumpTexture(Scene *this,string *_name,string *_path,bool _flip,bool _verbose)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  ostream *poVar4;
  Texture *this_00;
  mapped_type *ppTVar5;
  stat st;
  stat local_c0;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
          ::find(&(this->textures)._M_t,_name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->textures)._M_t._M_impl.super__Rb_tree_header) {
    iVar2 = stat((_path->_M_dataplus)._M_p,&local_c0);
    if (iVar2 == 0) {
      this_00 = (Texture *)operator_new(0x48);
      this_00->_vptr_Texture = (_func_int **)0x0;
      (this_00->m_path)._M_dataplus._M_p = (pointer)0x0;
      (this_00->m_path)._M_string_length = 0;
      (this_00->m_path).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(this_00->m_path).field_2 + 8) = 0;
      this_00->m_width = 0;
      this_00->m_height = 0;
      this_00->m_format = 0;
      this_00->m_type = 0;
      this_00->m_filter = LINEAR;
      this_00->m_wrap = REPEAT;
      this_00->m_vFlip = false;
      *(undefined3 *)&this_00->field_0x41 = 0;
      this_00->m_id = 0;
      Texture::Texture(this_00);
      this_00->_vptr_Texture = (_func_int **)&PTR__Texture_003ed790;
      bVar1 = TextureBump::load((TextureBump *)this_00,_path,_flip);
      if (bVar1) {
        ppTVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                  ::operator[](&this->textures,_name);
        *ppTVar5 = this_00;
        if (_verbose) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"// ",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(_path->_M_dataplus)._M_p,
                              _path->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," loaded and transform to normalmap as: ",0x27);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"uniform sampler2D   ",0x14);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(_name->_M_dataplus)._M_p,
                              _name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"uniform vec2        ",0x14);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(_name->_M_dataplus)._M_p,
                              _name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Resolution;",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
      }
      else {
        (*this_00->_vptr_Texture[1])(this_00);
      }
      if (bVar1) {
        return true;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error watching for file ",0x18);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(_path->_M_dataplus)._M_p,_path->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  return false;
}

Assistant:

bool Scene::addBumpTexture(const std::string& _name, const std::string& _path, bool _flip, bool _verbose) {
    if (textures.find(_name) == textures.end()) {
        struct stat st;

        // If we can not get file stamp proably is not a file
        if (stat(_path.c_str(), &st) != 0 )
            std::cerr << "Error watching for file " << _path << std::endl;
        
        // If we can lets proceed creating a texgure
        else {
            TextureBump* tex = new TextureBump();

            // load an image into the texture
            if (tex->load(_path, _flip)) {

                // the image is loaded finish add the texture to the uniform list
                textures[_name] = (Texture*)tex;

                if (_verbose) {
                    std::cout << "// " << _path << " loaded and transform to normalmap as: " << std::endl;
                    std::cout << "uniform sampler2D   " << _name  << ";"<< std::endl;
                    std::cout << "uniform vec2        " << _name  << "Resolution;"<< std::endl;
                }

                return true;
            }
            else
                delete tex;
        }
    }
    return false;
}